

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

int connection_byte_received(CONNECTION_HANDLE connection,uchar b)

{
  CONNECTION_STATE CVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  uchar b_local;
  CONNECTION_HANDLE connection_local;
  
  CVar1 = connection->connection_state;
  l._7_1_ = b;
  _result = connection;
  if (CVar1 == CONNECTION_STATE_START) {
LAB_00118804:
    if (b == "AMQP"[connection->header_bytes_received]) {
      connection->header_bytes_received = connection->header_bytes_received + 1;
      if (connection->header_bytes_received == 8) {
        if ((((byte)connection->field_0xe0 >> 3 & 1) == 1) &&
           (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
          (*p_Var3)(AZ_LOG_TRACE,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_byte_received",0x298,1,"<- Header (AMQP 0.1.0.0)");
        }
        connection_set_state(_result,CONNECTION_STATE_HDR_EXCH);
        iVar2 = send_open_frame(_result);
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                      ,"connection_byte_received",0x29f,1,"Cannot send open frame");
          }
          connection_set_state(_result,CONNECTION_STATE_END);
        }
      }
      l._0_4_ = 0;
    }
    else {
      iVar2 = xio_close(connection->io,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      if ((iVar2 != 0) && (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_byte_received",0x28b,1,"xio_close failed");
      }
      connection_set_state(_result,CONNECTION_STATE_END);
      l._0_4_ = 0x28f;
    }
  }
  else {
    if (CVar1 != CONNECTION_STATE_HDR_RCVD) {
      if (CVar1 == CONNECTION_STATE_HDR_SENT) goto LAB_00118804;
      if (((CVar1 != CONNECTION_STATE_HDR_EXCH) && (1 < CVar1 - CONNECTION_STATE_OPEN_RCVD)) &&
         (CVar1 != CONNECTION_STATE_OPENED)) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_byte_received",0x27d,1,"Unknown connection state: %d",
                    _result->connection_state);
        }
        return 0x27e;
      }
    }
    iVar2 = frame_codec_receive_bytes(connection->frame_codec,(uchar *)((long)&l + 7),1);
    if (iVar2 == 0) {
      l._0_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_byte_received",0x2ba,1,"Cannot process received bytes");
      }
      close_connection_with_error
                (_result,"amqp:internal-error",
                 "connection_byte_received::frame_codec_receive_bytes failed",(AMQP_VALUE)0x0);
      l._0_4_ = 0x2be;
    }
  }
  return (int)l;
}

Assistant:

static int connection_byte_received(CONNECTION_HANDLE connection, unsigned char b)
{
    int result;

    switch (connection->connection_state)
    {
    default:
        LogError("Unknown connection state: %d", (int)connection->connection_state);
        result = MU_FAILURE;
        break;

    /* Codes_S_R_S_CONNECTION_01_039: [START In this state a connection exists, but nothing has been sent or received. This is the state an implementation would be in immediately after performing a socket connect or socket accept.] */
    case CONNECTION_STATE_START:

    /* Codes_S_R_S_CONNECTION_01_041: [HDR SENT In this state the connection header has been sent to the peer but no connection header has been received.] */
    case CONNECTION_STATE_HDR_SENT:
        if (b != amqp_header[connection->header_bytes_received])
        {
            /* Codes_S_R_S_CONNECTION_01_089: [If the incoming and outgoing protocol headers do not match, both peers MUST close their outgoing stream] */
            if (xio_close(connection->io, NULL, NULL) != 0)
            {
                LogError("xio_close failed");
            }

            connection_set_state(connection, CONNECTION_STATE_END);
            result = MU_FAILURE;
        }
        else
        {
            connection->header_bytes_received++;
            if (connection->header_bytes_received == sizeof(amqp_header))
            {
                if (connection->is_trace_on == 1)
                {
                    LOG(AZ_LOG_TRACE, LOG_LINE, "<- Header (AMQP 0.1.0.0)");
                }

                connection_set_state(connection, CONNECTION_STATE_HDR_EXCH);

                if (send_open_frame(connection) != 0)
                {
                    LogError("Cannot send open frame");
                    connection_set_state(connection, CONNECTION_STATE_END);
                }
            }

            result = 0;
        }
        break;

    /* Codes_S_R_S_CONNECTION_01_040: [HDR RCVD In this state the connection header has been received from the peer but a connection header has not been sent.] */
    case CONNECTION_STATE_HDR_RCVD:

    /* Codes_S_R_S_CONNECTION_01_042: [HDR EXCH In this state the connection header has been sent to the peer and a connection header has been received from the peer.] */
    /* we should not really get into this state, but just in case, we would treat that in the same way as HDR_RCVD */
    case CONNECTION_STATE_HDR_EXCH:

    /* Codes_S_R_S_CONNECTION_01_045: [OPEN RCVD In this state the connection headers have been exchanged. An open frame has been received from the peer but an open frame has not been sent.] */
    case CONNECTION_STATE_OPEN_RCVD:

    /* Codes_S_R_S_CONNECTION_01_046: [OPEN SENT In this state the connection headers have been exchanged. An open frame has been sent to the peer but no open frame has yet been received.] */
    case CONNECTION_STATE_OPEN_SENT:

    /* Codes_S_R_S_CONNECTION_01_048: [OPENED In this state the connection header and the open frame have been both sent and received.] */
    case CONNECTION_STATE_OPENED:
        /* Codes_S_R_S_CONNECTION_01_212: [After the initial handshake has been done all bytes received from the io instance shall be passed to the frame_codec for decoding by calling frame_codec_receive_bytes.] */
        if (frame_codec_receive_bytes(connection->frame_codec, &b, 1) != 0)
        {
            LogError("Cannot process received bytes");
            /* Codes_S_R_S_CONNECTION_01_218: [The error amqp:internal-error shall be set in the error.condition field of the CLOSE frame.] */
            /* Codes_S_R_S_CONNECTION_01_219: [The error description shall be set to an implementation defined string.] */
            close_connection_with_error(connection, "amqp:internal-error", "connection_byte_received::frame_codec_receive_bytes failed", NULL);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }

        break;
    }

    return result;
}